

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

string * __thiscall
MipsOpcodeFormatter::formatOpcode_abi_cxx11_
          (MipsOpcodeFormatter *this,MipsOpcodeData *opData,MipsRegisterData *regData,
          MipsImmediateData *immData)

{
  std::__cxx11::string::assign((char *)this);
  handleOpcodeName(this,opData);
  while ((this->buffer)._M_string_length < 0xb) {
    std::__cxx11::string::push_back((char)this);
  }
  handleOpcodeParameters(this,opData,regData,immData);
  return &this->buffer;
}

Assistant:

const std::string& MipsOpcodeFormatter::formatOpcode(const MipsOpcodeData& opData, const MipsRegisterData& regData,
	const MipsImmediateData& immData)
{
	buffer = "   ";
	handleOpcodeName(opData);

	while (buffer.size() < 11)
		buffer += ' ';

	handleOpcodeParameters(opData,regData,immData);
	return buffer;
}